

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

char * mpack_node_data_unchecked(mpack_node_t node)

{
  mpack_type_t type;
  mpack_node_t node_local;
  
  mpack_node_error(node);
  return (node.tree)->data + (long)((node.data)->value).children;
}

Assistant:

MPACK_INLINE const char* mpack_node_data_unchecked(mpack_node_t node) {
    mpack_assert(mpack_node_error(node) == mpack_ok, "tree is in an error state!");

    mpack_type_t type = node.data->type;
    MPACK_UNUSED(type);
    mpack_assert(type == mpack_type_str || type == mpack_type_bin || type == mpack_type_ext,
            "node of type %i (%s) is not a data type!", type, mpack_type_to_string(type));

    return node.tree->data + node.data->value.offset;
}